

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_node_struct *pxVar1;
  xml_allocator *alloc;
  xml_allocator *pxVar2;
  xml_node_struct *dn_00;
  xml_node_struct *sn_00;
  xml_allocator *shared_alloc;
  xml_node_struct *node;
  
  alloc = get_allocator<pugi::xml_node_struct>(dn);
  pxVar2 = get_allocator<pugi::xml_node_struct>(sn);
  shared_alloc = (xml_allocator *)0x0;
  if (alloc == pxVar2) {
    shared_alloc = alloc;
  }
  node_copy_contents(dn,sn,shared_alloc);
  pxVar1 = sn->first_child;
  dn_00 = dn;
LAB_0011b50b:
  node = dn_00;
  sn_00 = pxVar1;
  if ((sn_00 == (xml_node_struct *)0x0) || (sn_00 == sn)) {
    return;
  }
  if ((sn_00 != dn) &&
     (dn_00 = append_new_node(node,alloc,
                              (xml_node_type)sn_00->header & (node_doctype|node_declaration)),
     dn_00 != (xml_node_struct *)0x0)) goto code_r0x0011b536;
  goto LAB_0011b557;
code_r0x0011b536:
  node_copy_contents(dn_00,sn_00,shared_alloc);
  pxVar1 = sn_00->first_child;
  if (sn_00->first_child == (xml_node_struct *)0x0) {
LAB_0011b557:
    do {
      pxVar1 = sn_00->next_sibling;
      dn_00 = node;
      if (sn_00->next_sibling != (xml_node_struct *)0x0) break;
      sn_00 = sn_00->parent;
      node = node->parent;
      pxVar1 = sn_00;
      dn_00 = node;
    } while (sn_00 != sn);
  }
  goto LAB_0011b50b;
}

Assistant:

PUGI__FN void node_copy_tree(xml_node_struct* dn, xml_node_struct* sn)
	{
		xml_allocator& alloc = get_allocator(dn);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sn)) ? &alloc : 0;

		node_copy_contents(dn, sn, shared_alloc);

		xml_node_struct* dit = dn;
		xml_node_struct* sit = sn->first_child;

		while (sit && sit != sn)
		{
			// when a tree is copied into one of the descendants, we need to skip that subtree to avoid an infinite loop
			if (sit != dn)
			{
				xml_node_struct* copy = append_new_node(dit, alloc, PUGI__NODETYPE(sit));

				if (copy)
				{
					node_copy_contents(copy, sit, shared_alloc);

					if (sit->first_child)
					{
						dit = copy;
						sit = sit->first_child;
						continue;
					}
				}
			}

			// continue to the next node
			do
			{
				if (sit->next_sibling)
				{
					sit = sit->next_sibling;
					break;
				}

				sit = sit->parent;
				dit = dit->parent;
			}
			while (sit != sn);
		}
	}